

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<proto2_unittest::TestProto3Optional_NestedEnum>
               (TestProto3Optional_NestedEnum *value,ostream *os)

{
  ostream *os_local;
  TestProto3Optional_NestedEnum *value_local;
  
  ((void)((*{parm#2})<<{parm#1}))testing::internal::
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::PrintValue<proto2_unittest::
  TestProto3Optional_NestedEnum_void>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}